

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  string text;
  stringstream strStream;
  ifstream inFile;
  string local_3d8;
  string local_3b8;
  stringstream local_398 [16];
  ostream local_388 [112];
  ios_base local_318 [264];
  char local_210 [16];
  streambuf local_200 [504];
  
  std::ifstream::ifstream(local_210);
  std::ifstream::open(local_210,0x115110);
  std::__cxx11::stringstream::stringstream(local_398);
  std::ostream::operator<<(local_388,local_200);
  std::__cxx11::stringbuf::str();
  compile(&local_3b8,&local_3d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_398);
  std::ios_base::~ios_base(local_318);
  std::ifstream::~ifstream(local_210);
  return 0;
}

Assistant:

int main() {
    ifstream inFile;
    inFile.open("yourinputfiledirectory");
    stringstream strStream;
    strStream << inFile.rdbuf();
    string text = strStream.str();
    compile(text);
    return 0;
}